

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

char * l_str2dloc(char *s,lua_Number *result,int mode)

{
  lua_Number *local_40;
  lua_Number local_38;
  lua_Number *local_30;
  char *endptr;
  lua_Number *plStack_20;
  int mode_local;
  lua_Number *result_local;
  char *s_local;
  
  endptr._4_4_ = mode;
  plStack_20 = result;
  result_local = (lua_Number *)s;
  if (mode == 0x78) {
    local_38 = strtod(s,(char **)&local_30);
  }
  else {
    local_38 = strtod(s,(char **)&local_30);
  }
  *plStack_20 = local_38;
  if (local_30 == result_local) {
    s_local = (char *)0x0;
  }
  else {
    while ((""[(int)(*(byte *)local_30 + 1)] & 8) != 0) {
      local_30 = (lua_Number *)((long)local_30 + 1);
    }
    if (*(byte *)local_30 == 0) {
      local_40 = local_30;
    }
    else {
      local_40 = (lua_Number *)0x0;
    }
    s_local = (char *)local_40;
  }
  return s_local;
}

Assistant:

static const char *l_str2dloc(const char *s, lua_Number *result, int mode) {
    char *endptr;
    *result = (mode == 'x') ? lua_strx2number(s, &endptr)  /* try to convert */
                            : lua_str2number(s, &endptr);
    if (endptr == s) return NULL;  /* nothing recognized? */
    while (lisspace(cast_uchar(*endptr))) endptr++;  /* skip trailing spaces */
    return (*endptr == '\0') ? endptr : NULL;  /* OK if no trailing characters */
}